

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O0

Chromosome * __thiscall
tsp::Chromosome::crossover
          (Chromosome *__return_storage_ptr__,Chromosome *this,Chromosome *chromosome,uint pcross)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  const_reference pvVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  value_type value;
  int indexP;
  int indexC;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  size_type local_30;
  size_type size;
  Chromosome *pCStack_20;
  uint pcross_local;
  Chromosome *chromosome_local;
  Chromosome *this_local;
  Chromosome *child;
  
  size._3_1_ = 0;
  size._4_4_ = pcross;
  pCStack_20 = chromosome;
  chromosome_local = this;
  this_local = __return_storage_ptr__;
  Chromosome(__return_storage_ptr__);
  local_30 = std::vector<int,_std::allocator<int>_>::size(&this->values);
  std::vector<int,_std::allocator<int>_>::resize(&__return_storage_ptr__->values,local_30);
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&__return_storage_ptr__->values);
  _indexC = std::vector<int,_std::allocator<int>_>::end(&__return_storage_ptr__->values);
  indexP = 0;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_48,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_indexC,
             &indexP);
  value = 0;
  for (it._M_current._4_4_ = 0; it._M_current._4_4_ < size._4_4_;
      it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->values,(long)(int)it._M_current._4_4_);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&__return_storage_ptr__->values,(long)value);
    *pvVar3 = vVar1;
    value = value + 1;
  }
  while ((ulong)(long)value < local_30) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&pCStack_20->values,(ulong)(long)(int)it._M_current._4_4_ % local_30);
    it._M_current._0_4_ = *pvVar4;
    local_70._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&__return_storage_ptr__->values);
    local_78 = (int *)std::vector<int,_std::allocator<int>_>::end(&__return_storage_ptr__->values);
    local_68 = std::
               find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                         (local_70,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_78,(int *)&it);
    local_80._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end(&__return_storage_ptr__->values);
    bVar2 = __gnu_cxx::operator==(&local_68,&local_80);
    vVar1 = (value_type)it._M_current;
    if (bVar2) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&__return_storage_ptr__->values,(long)value);
      *pvVar3 = vVar1;
      value = value + 1;
    }
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Chromosome Chromosome::crossover(const Chromosome &chromosome, unsigned int pcross) {
        Chromosome child = Chromosome();

        auto size = this->values.size();
        child.values.resize(size);

        std::fill(child.values.begin(), child.values.end(), 0);

        int indexC = 0;
        int indexP = 0;

        for (indexP = 0; indexP < pcross; ++indexP) {
            child.values[indexC] = this->values[indexP];
            ++indexC;
        }

        while (indexC < size) {
            auto value = chromosome.values[indexP % size];
            auto it = std::find(child.values.begin(), child.values.end(), value);

            if (it == child.values.end()) {
                child.values[indexC] = value;
                ++indexC;
            }

            ++indexP;
        }

        return child;
    }